

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v8::detail::value<fmt::v8::basic_format_context<fmt::v8::appender,char>>::
     format_custom_arg<spdlog::stopwatch,fmt::v8::formatter<spdlog::stopwatch,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v8::appender,_char> *ctx)

{
  iterator it;
  basic_format_context<fmt::v8::appender,_char> *in_RDX;
  basic_format_parse_context<char,_fmt::v8::detail::error_handler> *in_stack_00000010;
  formatter<double,_char,_void> *in_stack_00000018;
  formatter<spdlog::stopwatch,_char,_void> f;
  iterator in_stack_ffffffffffffff98;
  basic_format_parse_context<char,_fmt::v8::detail::error_handler> *in_stack_ffffffffffffffa0;
  basic_format_context<fmt::v8::appender,_char> *in_stack_ffffffffffffffc8;
  stopwatch *in_stack_ffffffffffffffd0;
  formatter<spdlog::stopwatch,_char,_void> *in_stack_ffffffffffffffd8;
  
  formatter<spdlog::stopwatch,_char,_void>::formatter
            ((formatter<spdlog::stopwatch,_char,_void> *)0x14edfd);
  formatter<double,char,void>::
  parse<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>
            (in_stack_00000018,in_stack_00000010);
  basic_format_parse_context<char,_fmt::v8::detail::error_handler>::advance_to
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  it = formatter<spdlog::stopwatch,char,void>::
       format<fmt::v8::basic_format_context<fmt::v8::appender,char>>
                 (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  basic_format_context<fmt::v8::appender,_char>::advance_to(in_RDX,it);
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }